

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hough_approach.cpp
# Opt level: O0

vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *
hough_approach(vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *__return_storage_ptr__,
              Mat *img,bool debug)

{
  _OutputArray local_178;
  _InputArray local_160;
  undefined1 local_141;
  _InputArray local_140;
  allocator<char> local_121;
  string local_120 [39];
  allocator<char> local_f9;
  string local_f8 [32];
  _OutputArray local_d8;
  _InputArray local_b0;
  Mat local_98 [8];
  Mat canny_output;
  bool gradient;
  int aperture_size;
  double hysteresis_threshold2;
  double hysteresis_threshold1;
  bool debug_local;
  Mat *img_local;
  vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_> *lines;
  
  cv::Mat::Mat(local_98);
  cv::_InputArray::_InputArray(&local_b0,img);
  cv::_OutputArray::_OutputArray(&local_d8,local_98);
  cv::Canny(&local_b0,&local_d8,0.0,0.0,5,false);
  cv::_OutputArray::~_OutputArray(&local_d8);
  cv::_InputArray::~_InputArray(&local_b0);
  if (debug) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_f8,"Canny",&local_f9);
    cv::namedWindow(local_f8,0);
    std::__cxx11::string::~string(local_f8);
    std::allocator<char>::~allocator(&local_f9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(local_120,"Canny",&local_121);
    cv::_InputArray::_InputArray(&local_140,local_98);
    cv::imshow(local_120,&local_140);
    cv::_InputArray::~_InputArray(&local_140);
    std::__cxx11::string::~string(local_120);
    std::allocator<char>::~allocator(&local_121);
    cv::waitKey(0);
    cv::destroyAllWindows();
  }
  local_141 = 0;
  std::vector<cv::Vec<int,_4>,_std::allocator<cv::Vec<int,_4>_>_>::vector(__return_storage_ptr__);
  cv::_InputArray::_InputArray(&local_160,local_98);
  cv::_OutputArray::_OutputArray<cv::Vec<int,4>>(&local_178,__return_storage_ptr__);
  cv::HoughLinesP(&local_160,&local_178,1.0,0.017453292519943295,100,0.0,0.0);
  cv::_OutputArray::~_OutputArray(&local_178);
  cv::_InputArray::~_InputArray(&local_160);
  local_141 = 1;
  cv::Mat::~Mat(local_98);
  return __return_storage_ptr__;
}

Assistant:

std::vector<cv::Vec4i> hough_approach(const cv::Mat& img, bool debug)
{
    double hysteresis_threshold1 = 0;
    double hysteresis_threshold2 = 0;
    int aperture_size = 5;
    bool gradient = false;
    cv::Mat canny_output;

    cv::Canny(img, canny_output, hysteresis_threshold1, hysteresis_threshold2, aperture_size, gradient);

    if(debug)
    {
        cv::namedWindow("Canny", cv::WINDOW_NORMAL);
        cv::imshow("Canny", canny_output);
        cv::waitKey(0);
        cv::destroyAllWindows();

        // cv::Mat color_convert;
        // cv::cvtColor(canny_output, color_convert, cv::COLOR_GRAY2BGR);

        // cv::namedWindow("gray", cv::WINDOW_NORMAL);
        // cv::imshow("gray", color_convert);
        // cv::waitKey(0);
        // cv::destroyAllWindows();
    }

    std::vector<cv::Vec4i> lines;
    cv::HoughLinesP(canny_output, lines, 1, CV_PI / 180, 100, 0, 0);

    return lines;
}